

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O0

void ReturnProcedure(void)

{
  int iVar1;
  int iVar2;
  int linenumber;
  int id;
  
  EnterCriticalSection(&MissionFilesCS);
  if (bMissionRunning == 0) {
    printf("Cannot use return outside a mission file.\n");
    LeaveCriticalSection(&MissionFilesCS);
  }
  else if ((procstack < 0) || (0xff < procstack)) {
    printf("Procedure stack error.\n");
    LeaveCriticalSection(&MissionFilesCS);
  }
  else if (procstack == 0) {
    printf("Unexpected return command.\n");
    LeaveCriticalSection(&MissionFilesCS);
  }
  else {
    iVar1 = procstackids[procstack + -1];
    if ((iVar1 < 0) || (0xff < iVar1)) {
      printf("Invalid parameter.\n");
      LeaveCriticalSection(&MissionFilesCS);
    }
    else {
      if (procreturnaddrs[iVar1] < 1) {
        printf("Invalid parameter.\n");
      }
      else {
        iVar2 = fsetline(missionfile,procreturnaddrs[iVar1]);
        if (iVar2 == 0) {
          procstackids[procstack + -1] = 0;
          procstack = procstack + -1;
          procreturnaddrs[iVar1] = 0;
        }
        else {
          printf("return failed.\n");
        }
      }
      LeaveCriticalSection(&MissionFilesCS);
    }
  }
  return;
}

Assistant:

inline void ReturnProcedure(void)
{
	int id = 0, linenumber = 0;
	EnterCriticalSection(&MissionFilesCS);
	if (!bMissionRunning)
	{
		printf("Cannot use return outside a mission file.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if ((procstack < 0)||(procstack >= MAX_NB_PROCEDURES)) 
	{
		printf("Procedure stack error.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	if (procstack == 0) 
	{
		printf("Unexpected return command.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	id = procstackids[procstack-1];
	if ((id < 0)||(id >= MAX_NB_PROCEDURES))
	{
		printf("Invalid parameter.\n");
		LeaveCriticalSection(&MissionFilesCS);
		return;
	}
	// Go to the next line after the execute command.
	linenumber = procreturnaddrs[id];
	if (linenumber > 0)
	{
		if (fsetline(missionfile, linenumber) != EXIT_SUCCESS)
		{
			printf("return failed.\n");
		}
		else
		{
			procstackids[procstack-1] = 0;
			procstack--;
			procreturnaddrs[id] = 0;
		}
	}
	else
	{
		printf("Invalid parameter.\n");
	}
	LeaveCriticalSection(&MissionFilesCS);
}